

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O1

void jessilib::impl_join::
     join_append<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&,std::basic_string_view<char,std::char_traits<char>>>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *out_string,
               basic_string_view<char,_std::char_traits<char>_> *in_string,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_args,
               basic_string_view<char,_std::char_traits<char>_> *in_args_1)

{
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (out_string,in_string->_M_str,in_string->_M_len);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (out_string,(in_args->_M_dataplus)._M_p,in_args->_M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (out_string,in_args_1->_M_str,in_args_1->_M_len);
  return;
}

Assistant:

constexpr void join_append(OutT& out_string, InT&& in_string, ArgsT&&... in_args) {
	using InCharT = typename std::remove_cvref_t<InT>::value_type;
	if constexpr (std::is_same_v<typename std::remove_cvref_t<OutT>::value_type, InCharT>) {
		// Join these straight together
		out_string += std::forward<InT>(in_string);
	}
	else {
		// Append over all the codepoints
		decode_result decode;
		std::basic_string_view<InCharT> in_view = in_string;
		while ((decode = decode_codepoint(in_view)).units != 0) {
			encode_codepoint(out_string, decode.codepoint);
			in_view.remove_prefix(decode.units);
		}
	}

	join_append(out_string, std::forward<ArgsT>(in_args)...);
}